

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O0

void PhyloTree::getCommonEdges
               (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges,
               vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges,
               vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *dest)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *pdVar1;
  bool bVar2;
  int iVar3;
  pointer pPVar4;
  PhyloTreeEdge *in_RDX;
  double dVar5;
  double dVar6;
  back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_> common_bkinstr;
  iterator last2;
  iterator last1;
  iterator first2;
  iterator first1;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  PhyloTreeEdge *in_stack_fffffffffffffe30;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  in_stack_fffffffffffffe38;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  in_stack_fffffffffffffe40;
  Bipartition *in_stack_fffffffffffffe48;
  int originalID;
  back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  in_stack_fffffffffffffe50;
  PhyloTreeEdge *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  bool local_14d;
  back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_> local_118 [15];
  int local_a0;
  double local_90;
  back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_> local_60;
  PhyloTreeEdge *local_58;
  PhyloTreeEdge *local_50;
  PhyloTreeEdge local_48;
  
  local_48.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &in_RDX->super_Bipartition;
  local_48.length =
       (double)std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                         ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                          CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_48.super_Bipartition.partition.m_num_bits =
       (size_type)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                 ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  std::
  sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_48.super_Bipartition.partition.m_bits.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                          ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_48.super_Bipartition.partition.m_bits.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                                 ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  std::
  sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>>
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_48.super_Bipartition.partition.m_bits.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                                ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_48.super_Bipartition._vptr_Bipartition =
       (_func_int **)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                 ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                  CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_50 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_58 = (PhyloTreeEdge *)
             std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  local_60 = std::back_inserter<std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                        CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_fffffffffffffe30,
                       (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    local_14d = false;
    if (bVar2) {
      local_14d = __gnu_cxx::operator!=
                            ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                              *)in_stack_fffffffffffffe30,
                             (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                              *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
    if (local_14d == false) break;
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator*((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 *)&local_48.super_Bipartition.partition);
    __gnu_cxx::
    __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
    ::operator*((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 *)&local_48);
    bVar2 = Bipartition::operator<
                      (&in_stack_fffffffffffffe30->super_Bipartition,
                       (Bipartition *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
    ;
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator->((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                    *)&local_48.super_Bipartition.partition);
      bVar2 = PhyloTreeEdge::isCompatibleWith
                        (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50.container);
      if (bVar2) {
        pdVar1 = &local_48.super_Bipartition.partition;
        __gnu_cxx::
        __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
        ::operator->((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                      *)pdVar1);
        PhyloTreeEdge::asSplit
                  ((PhyloTreeEdge *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        pPVar4 = __gnu_cxx::
                 __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 ::operator->((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                               *)pdVar1);
        local_90 = PhyloTreeEdge::getAttribute(pPVar4);
        pPVar4 = __gnu_cxx::
                 __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 ::operator->((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                               *)&local_48.super_Bipartition.partition);
        local_a0 = PhyloTreeEdge::getOriginalID(pPVar4);
        std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
        emplace_back<Bipartition,double,int>
                  (in_stack_fffffffffffffe50.container,in_stack_fffffffffffffe48,
                   (double *)in_stack_fffffffffffffe40._M_current,
                   (int *)in_stack_fffffffffffffe38._M_current);
        Bipartition::~Bipartition((Bipartition *)0x1deb09);
      }
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator++((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                    *)&local_48.super_Bipartition.partition);
    }
    else {
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator*((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                   *)&local_48);
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator*((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                   *)&local_48.super_Bipartition.partition);
      bVar2 = Bipartition::operator<
                        (&in_stack_fffffffffffffe30->super_Bipartition,
                         (Bipartition *)
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
        ::operator->((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                      *)&local_48);
        bVar2 = PhyloTreeEdge::isCompatibleWith
                          (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50.container);
        if (bVar2) {
          in_stack_fffffffffffffe38._M_current = &local_48;
          in_stack_fffffffffffffe30 =
               (PhyloTreeEdge *)
               local_48.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          __gnu_cxx::
          __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
          ::operator->((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                        *)in_stack_fffffffffffffe38._M_current);
          PhyloTreeEdge::asSplit
                    ((PhyloTreeEdge *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28))
          ;
          pPVar4 = __gnu_cxx::
                   __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                   ::operator->((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                                 *)in_stack_fffffffffffffe38._M_current);
          in_stack_fffffffffffffe40._M_current =
               (PhyloTreeEdge *)PhyloTreeEdge::getAttribute(pPVar4);
          pPVar4 = __gnu_cxx::
                   __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                   ::operator->((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                                 *)&local_48);
          in_stack_fffffffffffffe2c = PhyloTreeEdge::getOriginalID(pPVar4);
          std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
          emplace_back<Bipartition,double,int>
                    (in_stack_fffffffffffffe50.container,in_stack_fffffffffffffe48,
                     (double *)in_stack_fffffffffffffe40._M_current,
                     (int *)in_stack_fffffffffffffe38._M_current);
          Bipartition::~Bipartition((Bipartition *)0x1dedb7);
        }
      }
      else {
        pdVar1 = &local_48.super_Bipartition.partition;
        __gnu_cxx::
        __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
        ::operator->((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                      *)pdVar1);
        originalID = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
        PhyloTreeEdge::asSplit
                  ((PhyloTreeEdge *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        pPVar4 = __gnu_cxx::
                 __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 ::operator->((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                               *)pdVar1);
        dVar5 = PhyloTreeEdge::getLength(pPVar4);
        pPVar4 = __gnu_cxx::
                 __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 ::operator->((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                               *)&local_48);
        dVar6 = PhyloTreeEdge::getLength(pPVar4);
        in_stack_fffffffffffffe58 = (PhyloTreeEdge *)(dVar5 - dVar6);
        pPVar4 = __gnu_cxx::
                 __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                 ::operator->((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                               *)&local_48.super_Bipartition.partition);
        iVar3 = PhyloTreeEdge::getOriginalID(pPVar4);
        PhyloTreeEdge::PhyloTreeEdge
                  ((PhyloTreeEdge *)CONCAT44(iVar3,in_stack_fffffffffffffe60),
                   &in_stack_fffffffffffffe58->super_Bipartition,
                   (double)in_stack_fffffffffffffe50.container,originalID);
        in_stack_fffffffffffffe50 =
             std::back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
             ::operator++(&local_60,0);
        local_118[0] = in_stack_fffffffffffffe50;
        in_stack_fffffffffffffe48 =
             (Bipartition *)
             std::back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
             ::operator*(local_118);
        std::back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>::
        operator=((back_insert_iterator<std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                   *)in_stack_fffffffffffffe30,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        PhyloTreeEdge::~PhyloTreeEdge(in_stack_fffffffffffffe30);
        Bipartition::~Bipartition((Bipartition *)0x1dec87);
        __gnu_cxx::
        __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
        ::operator++((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                      *)&local_48.super_Bipartition.partition);
      }
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator++((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                    *)&local_48);
    }
  }
  return;
}

Assistant:

void PhyloTree::getCommonEdges(vector<PhyloTreeEdge> &t1_edges, vector<PhyloTreeEdge> &t2_edges, vector<PhyloTreeEdge> &dest) {
    std::sort(t1_edges.begin(), t1_edges.end());
    std::sort(t2_edges.begin(), t2_edges.end());

    auto first1 = t1_edges.begin();
    auto first2 = t2_edges.begin();
    auto last1 = t1_edges.end();
    auto last2 = t2_edges.end();
    auto common_bkinstr = std::back_inserter(dest);

    while (first1 != last1 && first2 != last2) {
        if (*first1 < *first2) {
            if (first1->isCompatibleWith(t2_edges)) {
                dest.emplace_back(first1->asSplit(), first1->getAttribute(), first1->getOriginalID());
            }
            ++first1; // first1 not in list2
        } else {
            if (!(*first2 < *first1)) { // first1 == first2
                *common_bkinstr++ = std::move(PhyloTreeEdge(first1->asSplit(), first1->getLength() - first2->getLength(), first1->getOriginalID()));
                ++first1;
            }
            else { // first2 not in list1
                if (first2->isCompatibleWith(t1_edges)) {
                    dest.emplace_back(first2->asSplit(), first2->getAttribute(), first2->getOriginalID());
                }
            }
            ++first2;
        }
    }
}